

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O3

_Bool intersect_uint16_nonempty(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort uVar3;
  uint16_t uVar4;
  
  if (lenB != 0 && lenA != 0) {
    puVar1 = A + lenA;
    puVar2 = B + lenB;
    uVar4 = *B;
    do {
      uVar3 = *A;
      if (uVar4 <= uVar3) {
        while( true ) {
          uVar4 = *B;
          if (uVar3 <= uVar4) break;
          B = B + 1;
          if (B == puVar2) {
            return false;
          }
        }
        if (uVar3 == uVar4) {
          return true;
        }
      }
      A = A + 1;
    } while (A != puVar1);
  }
  return false;
}

Assistant:

bool intersect_uint16_nonempty(const uint16_t *A, const size_t lenA,
                               const uint16_t *B, const size_t lenB) {
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return false;
        }
        while (*A > *B) {
            if (++B == endB) return false;
        }
        if (*A == *B) {
            return true;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    return false;  // NOTREACHED
}